

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void anon_unknown.dwarf_161f4de::AddInterfaceEntries
               (cmGeneratorTarget *headTarget,string *config,string *prop,string *lang,
               cmGeneratorExpressionDAGChecker *dagChecker,EvaluatedTargetPropertyEntries *entries,
               IncludeRuntimeInterface searchRuntime,LinkInterfaceFor interfaceFor)

{
  cmLinkImplementation *libraries;
  const_iterator cVar1;
  
  if (searchRuntime == Yes) {
    libraries = cmGeneratorTarget::GetLinkImplementation(headTarget,config,interfaceFor,false);
    if (libraries == (cmLinkImplementation *)0x0) {
      return;
    }
    entries->HadContextSensitiveCondition =
         (libraries->super_cmLinkImplementationLibraries).HadContextSensitiveCondition;
    cVar1 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(libraries->LanguageRuntimeLibraries)._M_h,lang);
    if (cVar1.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      addInterfaceEntry(headTarget,config,prop,lang,dagChecker,entries,interfaceFor,
                        (vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)
                        ((long)cVar1.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_true>
                               ._M_cur + 0x28));
    }
  }
  else {
    libraries = (cmLinkImplementation *)
                cmGeneratorTarget::GetLinkImplementationLibrariesInternal
                          (headTarget,config,headTarget,interfaceFor);
    if (libraries == (cmLinkImplementation *)0x0) {
      return;
    }
    entries->HadContextSensitiveCondition =
         (libraries->super_cmLinkImplementationLibraries).HadContextSensitiveCondition;
  }
  addInterfaceEntry(headTarget,config,prop,lang,dagChecker,entries,interfaceFor,
                    (vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)libraries);
  return;
}

Assistant:

void AddInterfaceEntries(
  cmGeneratorTarget const* headTarget, std::string const& config,
  std::string const& prop, std::string const& lang,
  cmGeneratorExpressionDAGChecker* dagChecker,
  EvaluatedTargetPropertyEntries& entries,
  IncludeRuntimeInterface searchRuntime,
  LinkInterfaceFor interfaceFor = LinkInterfaceFor::Usage)
{
  if (searchRuntime == IncludeRuntimeInterface::Yes) {
    if (cmLinkImplementation const* impl =
          headTarget->GetLinkImplementation(config, interfaceFor)) {
      entries.HadContextSensitiveCondition =
        impl->HadContextSensitiveCondition;

      auto runtimeLibIt = impl->LanguageRuntimeLibraries.find(lang);
      if (runtimeLibIt != impl->LanguageRuntimeLibraries.end()) {
        addInterfaceEntry(headTarget, config, prop, lang, dagChecker, entries,
                          interfaceFor, runtimeLibIt->second);
      }
      addInterfaceEntry(headTarget, config, prop, lang, dagChecker, entries,
                        interfaceFor, impl->Libraries);
    }
  } else {
    if (cmLinkImplementationLibraries const* impl =
          headTarget->GetLinkImplementationLibraries(config, interfaceFor)) {
      entries.HadContextSensitiveCondition =
        impl->HadContextSensitiveCondition;
      addInterfaceEntry(headTarget, config, prop, lang, dagChecker, entries,
                        interfaceFor, impl->Libraries);
    }
  }
}